

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1-cxx.cpp
# Opt level: O0

tuple<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_bool> * __thiscall
Secp256K1::Sign(tuple<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_bool>
                *__return_storage_ptr__,Secp256K1 *this,uint8_t *hash)

{
  secp256k1_context *psVar1;
  uchar *seckey;
  reference output;
  bool local_f1 [8];
  bool local_e9;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_e8;
  size_t local_c8;
  size_t sigOutSize;
  undefined1 local_b8 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> sigOut;
  bool local_89;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  int local_64;
  undefined1 local_60 [4];
  int ret;
  secp256k1_ecdsa_signature sig;
  uint8_t *hash_local;
  Secp256K1 *this_local;
  
  psVar1 = this->ctx;
  sig.data._56_8_ = hash;
  seckey = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->privKey);
  local_64 = secp256k1_ecdsa_sign
                       (psVar1,(secp256k1_ecdsa_signature *)local_60,hash,seckey,
                        nonce_function_rfc6979,(void *)0x0);
  if (local_64 == 1) {
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&sigOutSize + 7));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b8,0x48,
               (allocator<unsigned_char> *)((long)&sigOutSize + 7));
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&sigOutSize + 7));
    local_c8 = 0x48;
    psVar1 = this->ctx;
    output = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b8,0);
    local_64 = secp256k1_ecdsa_signature_serialize_der
                         (psVar1,output,&local_c8,(secp256k1_ecdsa_signature *)local_60);
    if (local_64 == 1) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b8,local_c8);
      local_f1[0] = true;
      std::make_tuple<std::vector<unsigned_char,std::allocator<unsigned_char>>&,bool>
                (__return_storage_ptr__,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b8,local_f1);
    }
    else {
      local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_e8);
      local_e9 = false;
      std::make_tuple<std::vector<unsigned_char,std::allocator<unsigned_char>>,bool>
                (__return_storage_ptr__,&local_e8,&local_e9);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_e8);
    }
    local_f1[1] = true;
    local_f1[2] = false;
    local_f1[3] = false;
    local_f1[4] = false;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b8);
  }
  else {
    local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_88);
    local_89 = false;
    std::make_tuple<std::vector<unsigned_char,std::allocator<unsigned_char>>,bool>
              (__return_storage_ptr__,&local_88,&local_89);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_88);
  }
  return __return_storage_ptr__;
}

Assistant:

std::tuple<std::vector<uint8_t>, bool> Secp256K1::Sign(
    const uint8_t* hash) const
{
    // Make signature.
    secp256k1_ecdsa_signature sig;
    int ret = secp256k1_ecdsa_sign(ctx, &sig, hash, privKey.data(),
        secp256k1_nonce_function_rfc6979, nullptr);
    if (ret != 1) {
        // Failed to sign.
        return std::make_tuple(std::vector<uint8_t>(), false);
    }

    // Serialize signature.
    std::vector<uint8_t> sigOut(72);
    size_t sigOutSize = 72;
    ret = secp256k1_ecdsa_signature_serialize_der(
        ctx, &sigOut[0], &sigOutSize, &sig);
    if (ret != 1) {
        // Failed to serialize.
        return std::make_tuple(std::vector<uint8_t>(), false);
    }

    // Returns
    sigOut.resize(sigOutSize);
    return std::make_tuple(sigOut, true);
}